

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UCIAdapter.cpp
# Opt level: O0

void __thiscall senjo::UCIAdapter::NewCommand(UCIAdapter *this,char *params)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar3;
  undefined4 extraout_var_01;
  Output *pOVar4;
  Output local_50;
  char *local_48;
  char *move;
  Output local_38 [3];
  Output local_20;
  char *local_18;
  char *params_local;
  UCIAdapter *this_local;
  
  local_18 = params;
  params_local = (char *)this;
  bVar1 = ParamMatch((string *)token::Help_abi_cxx11_,&local_18);
  if (bVar1) {
    Output::Output(&local_20,InfoPrefix);
    pOVar4 = Output::operator<<(&local_20,(char (*) [8])"usage: ");
    pOVar4 = Output::operator<<(pOVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)token::New_abi_cxx11_);
    pOVar4 = Output::operator<<(pOVar4,(char (*) [3])0x1644d6);
    pOVar4 = Output::operator<<(pOVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)token::StartPos_abi_cxx11_);
    pOVar4 = Output::operator<<(pOVar4,(char (*) [2])"|");
    pOVar4 = Output::operator<<(pOVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)token::Fen_abi_cxx11_);
    pOVar4 = Output::operator<<(pOVar4,(char (*) [17])" <fen_string>] [");
    pOVar4 = Output::operator<<(pOVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)token::Moves_abi_cxx11_);
    Output::operator<<(pOVar4,(char (*) [13])0x164b12);
    Output::~Output(&local_20);
    Output::Output(local_38,InfoPrefix);
    Output::operator<<(local_38,(char (*) [55])
                                "Clear search data, set position, and apply <movelist>.");
    Output::~Output(local_38);
    Output::Output((Output *)&move,InfoPrefix);
    pOVar4 = Output::operator<<((Output *)&move,(char (*) [29])"If no position is specified ");
    pOVar4 = Output::operator<<(pOVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)token::StartPos_abi_cxx11_);
    Output::operator<<(pOVar4,(char (*) [13])" is assumed.");
    Output::~Output((Output *)&move);
  }
  else {
    UCINewGameCommand(this,"");
    if ((((local_18 == (char *)0x0) || (*local_18 == '\0')) ||
        (bVar1 = ParamMatch((string *)token::StartPos_abi_cxx11_,&local_18), bVar1)) ||
       (bVar1 = ParamMatch((string *)token::Moves_abi_cxx11_,&local_18), bVar1)) {
      iVar2 = (*this->engine->_vptr_ChessEngine[9])(this->engine,ChessEngine::_STARTPOS);
      pcVar3 = (char *)CONCAT44(extraout_var,iVar2);
    }
    else {
      ParamMatch((string *)token::Fen_abi_cxx11_,&local_18);
      iVar2 = (*this->engine->_vptr_ChessEngine[9])(this->engine,local_18);
      local_18 = (char *)CONCAT44(extraout_var_00,iVar2);
      pcVar3 = local_18;
    }
    if (pcVar3 != (char *)0x0) {
      ParamMatch((string *)token::Moves_abi_cxx11_,&local_18);
      do {
        bVar1 = false;
        if (local_18 != (char *)0x0) {
          pcVar3 = NextWord(&local_18);
          bVar1 = *pcVar3 != '\0';
        }
        if (!bVar1) goto LAB_0014b749;
        local_48 = local_18;
        bVar1 = IsMove(local_18);
        if (!bVar1) goto LAB_0014b749;
        iVar2 = (*this->engine->_vptr_ChessEngine[10])(this->engine,local_18);
        local_18 = (char *)CONCAT44(extraout_var_01,iVar2);
      } while (local_18 != (char *)0x0);
      Output::Output(&local_50,InfoPrefix);
      pOVar4 = Output::operator<<(&local_50,(char (*) [15])"Invalid move: ");
      Output::operator<<(pOVar4,&local_48);
      Output::~Output(&local_50);
LAB_0014b749:
      bVar1 = ChessEngine::IsDebugOn(this->engine);
      if (bVar1) {
        (*this->engine->_vptr_ChessEngine[0xc])();
      }
    }
  }
  return;
}

Assistant:

void UCIAdapter::NewCommand(const char* params)
{
  if (ParamMatch(token::Help, params)) {
    Output() << "usage: " << token::New << " [" << token::StartPos << "|"
             << token::Fen << " <fen_string>] [" << token::Moves
             << " <movelist>]";
    Output() << "Clear search data, set position, and apply <movelist>.";
    Output() << "If no position is specified " << token::StartPos
             << " is assumed.";
    return;
  }

  UCINewGameCommand("");

  if (!params || !*params ||
      ParamMatch(token::StartPos, params) ||
      ParamMatch(token::Moves, params))
  {
    if (!engine->SetPosition(ChessEngine::_STARTPOS)) {
      return;
    }
  }
  else {
    ParamMatch(token::Fen, params); // simply consume "fen" token if it present
    if (!(params = engine->SetPosition(params))) {
      return;
    }
  }

  // simply consume "moves" token if present
  ParamMatch(token::Moves, params);

  // apply moves (if any)
  while (params && *NextWord(params)) {
    const char* move = params;
    if (!IsMove(move)) {
      break;
    }
    if (!(params = engine->MakeMove(params))) {
      Output() << "Invalid move: " << move;
      break;
    }
  }

  if (engine->IsDebugOn()) {
    engine->PrintBoard();
  }
}